

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

void __thiscall duckdb::Command::Command(Command *this,SQLLogicTestRunner *runner)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Command_00a19c80;
  in_RDI[1] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  vector<duckdb::Condition,_true>::vector((vector<duckdb::Condition,_true> *)0x7ba74e);
  return;
}

Assistant:

Command::Command(SQLLogicTestRunner &runner) : runner(runner) {
}